

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O0

void __thiscall NaPNDelay::post_action(NaPNDelay *this)

{
  NaPetriCnInput *in_RDI;
  
  if (((ulong)in_RDI[5].super_NaPetriConnector.pcaLinked.pTail & 0x100000000) != 0) {
    NaPetriCnOutput::commit_data((NaPetriCnOutput *)0x14c77d);
  }
  NaPetriCnInput::commit_data(in_RDI);
  NaPetriCnOutput::commit_data((NaPetriCnOutput *)0x14c79c);
  if (*(int *)&in_RDI[5].super_NaPetriConnector.pcaLinked.pTail != 0) {
    *(int *)&in_RDI[5].super_NaPetriConnector.pcaLinked.pTail =
         *(int *)&in_RDI[5].super_NaPetriConnector.pcaLinked.pTail + -1;
  }
  return;
}

Assistant:

void
NaPNDelay::post_action ()
{
    if(bAwaken){
        // Output data are ready, so deliver them
        dout.commit_data();
    }

    // Welcome for new data
    in.commit_data();

    // Manage linked nodes
    sync.commit_data();

    // Decrement number of active sleeping ticks
    if(nActiveSleep != 0){
      --nActiveSleep;
    }
}